

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcProductDefinitionShape::~IfcProductDefinitionShape
          (IfcProductDefinitionShape *this)

{
  pointer pLVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  
  (this->super_IfcProductRepresentation).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x8b7090;
  *(undefined8 *)&(this->super_IfcProductRepresentation).field_0x88 = 0x8b70b8;
  pLVar1 = (this->super_IfcProductRepresentation).Representations.
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1);
  }
  pcVar2 = (this->super_IfcProductRepresentation).Description.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_IfcProductRepresentation).Description.ptr.field_2) {
    operator_delete(pcVar2);
  }
  puVar3 = *(undefined1 **)
            &(this->super_IfcProductRepresentation).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.field_0x10;
  if (puVar3 != &(this->super_IfcProductRepresentation).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>.
                 field_0x20) {
    operator_delete(puVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcProductDefinitionShape() : Object("IfcProductDefinitionShape") {}